

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<pickrst_test_highbd::PixelProjHighbdErrorTest_RandomValues_Test>::
CreateTest(ParameterizedTestFactory<pickrst_test_highbd::PixelProjHighbdErrorTest_RandomValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<long(*const)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,int*,int,int*,int,int*,sgr_params_type_const*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x48);
  Test::Test(this_00);
  *(undefined4 *)&this_00[2]._vptr_Test = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010af538;
  this_00[1]._vptr_Test = (_func_int **)&PTR__PixelProjHighbdErrorTest_RandomValues_Test_010af578;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }